

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

EncodingState * ZXing::Aztec::AddBinaryShiftChar(EncodingState *state,int index)

{
  const_reference pvVar1;
  long in_RSI;
  EncodingState *in_RDI;
  int deltaBitCount;
  int latch;
  int bitCount;
  int mode;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  EncodingState *result;
  undefined4 in_stack_ffffffffffffff68;
  int iVar2;
  int iVar3;
  Token in_stack_ffffffffffffff6c;
  EncodingState *this;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffb4;
  EncodingState *in_stack_ffffffffffffffb8;
  Token in_stack_ffffffffffffffc0;
  value_type_conflict3 in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  
  this = in_RDI;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             &in_stack_ffffffffffffffb8->tokens);
  local_34 = *(int *)(in_RSI + 0x18);
  local_38 = *(int *)(in_RSI + 0x20);
  if ((*(int *)(in_RSI + 0x18) == 4) || (*(int *)(in_RSI + 0x18) == 2)) {
    std::array<std::array<int,_5UL>,_5UL>::operator[]
              ((array<std::array<int,_5UL>,_5UL> *)this,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    pvVar1 = std::array<int,_5UL>::operator[]
                       ((array<int,_5UL> *)this,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffffc4 = *pvVar1;
    in_stack_ffffffffffffff6c = Token::CreateSimple((int)this,(int)in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff6c;
    std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::push_back
              (&this->tokens,
               (value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_38 = (in_stack_ffffffffffffffc4 >> 0x10) + local_38;
    local_34 = 0;
  }
  if ((*(int *)(in_RSI + 0x1c) == 0) || (*(int *)(in_RSI + 0x1c) == 0x1f)) {
    iVar2 = 0x12;
  }
  else {
    iVar2 = 8;
    if (*(int *)(in_RSI + 0x1c) == 0x3e) {
      iVar2 = 9;
    }
  }
  iVar3 = iVar2;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             &in_stack_ffffffffffffffb8->tokens);
  this->mode = local_34;
  this->binaryShiftByteCount = *(int *)(in_RSI + 0x1c) + 1;
  this->bitCount = local_38 + iVar2;
  if (this->binaryShiftByteCount == 0x81e) {
    EndBinaryShift(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    EncodingState::operator=(this,(EncodingState *)CONCAT44(in_stack_ffffffffffffff6c,iVar3));
    EncodingState::~EncodingState((EncodingState *)0x2657b0);
  }
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~vector
            (in_stack_ffffffffffffff80);
  return in_RDI;
}

Assistant:

static EncodingState AddBinaryShiftChar(const EncodingState& state, int index)
{
	auto tokens = state.tokens;
	int mode = state.mode;
	int bitCount = state.bitCount;
	if (state.mode == MODE_PUNCT || state.mode == MODE_DIGIT) {
		//assert binaryShiftByteCount == 0;
		int latch = LATCH_TABLE[mode][MODE_UPPER];
		tokens.push_back(Token::CreateSimple(latch & 0xFFFF, latch >> 16));
		bitCount += latch >> 16;
		mode = MODE_UPPER;
	}
	int deltaBitCount = (state.binaryShiftByteCount == 0 || state.binaryShiftByteCount == 31) ? 18 : (state.binaryShiftByteCount == 62) ? 9 : 8;
	EncodingState result{ tokens, mode, state.binaryShiftByteCount + 1, bitCount + deltaBitCount };
	if (result.binaryShiftByteCount == 2047 + 31) {
		// The string is as long as it's allowed to be.  We should end it.
		result = EndBinaryShift(result, index + 1);
	}
	return result;
}